

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_isojoliet_versioned.c
# Opt level: O0

void test_read_format_isojoliet_versioned(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive_conflict *a_00;
  char *pcVar4;
  archive *a;
  archive_entry *ae;
  char *refname;
  
  ae = (archive_entry *)anon_var_dwarf_256d0;
  extract_reference_file("test_read_format_iso_joliet_by_nero.iso.Z");
  a_00 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_versioned.c"
                   ,L'+',(uint)(a_00 != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_versioned.c"
                      ,L',',0,"0",(long)iVar1,"archive_read_support_filter_all(a)",(void *)0x0);
  iVar1 = archive_read_support_format_all((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_versioned.c"
                      ,L'-',0,"0",(long)iVar1,"archive_read_support_format_all(a)",(void *)0x0);
  iVar1 = archive_read_set_option((archive *)a_00,"iso9660","rockridge",(char *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_versioned.c"
                      ,L'/',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_read_set_option(a, \"iso9660\", \"rockridge\", NULL)",(void *)0x0);
  wVar2 = archive_read_open_filename(a_00,(char *)ae,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_versioned.c"
                      ,L'1',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, refname, 10240)",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_versioned.c"
                      ,L'4',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)0x0);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_versioned.c"
             ,L'5',".","\".\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_filetype((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_versioned.c"
                      ,L'6',0x4000,"AE_IFDIR",(ulong)mVar3,"archive_entry_filetype(ae)",(void *)0x0)
  ;
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_versioned.c"
                      ,L'9',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)0x0);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_versioned.c"
             ,L':',"test","\"test\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_filetype((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_versioned.c"
                      ,L';',0x4000,"AE_IFDIR",(ulong)mVar3,"archive_entry_filetype(ae)",(void *)0x0)
  ;
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_versioned.c"
                      ,L'<',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_versioned.c"
                      ,L'=',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a_00);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_versioned.c"
                      ,L'E',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)0x0);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_versioned.c"
             ,L'G',"test/test.txt","\"test/test.txt\"",pcVar4,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  mVar3 = archive_entry_filetype((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_versioned.c"
                      ,L'H',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",(void *)0x0)
  ;
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_versioned.c"
                      ,L'I',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_versioned.c"
                      ,L'J',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a_00);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_versioned.c"
                      ,L'M',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                      (void *)0x0);
  iVar1 = archive_filter_code((archive *)a_00,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_versioned.c"
                      ,L'P',(long)iVar1,"archive_filter_code(a, 0)",3,"ARCHIVE_FILTER_COMPRESS",
                      (void *)0x0);
  iVar1 = archive_read_close((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_versioned.c"
                      ,L'S',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a_00);
  iVar1 = archive_read_free((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_versioned.c"
                      ,L'T',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_isojoliet_versioned)
{
	const char *refname = "test_read_format_iso_joliet_by_nero.iso.Z";
	struct archive_entry *ae;
	struct archive *a;

	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualInt(0, archive_read_support_filter_all(a));
	assertEqualInt(0, archive_read_support_format_all(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_set_option(a, "iso9660", "rockridge", NULL));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* First entry is '.' root directory. */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString(".", archive_entry_pathname(ae));
	assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));

	/* A directory. */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString("test", archive_entry_pathname(ae));
	assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* A regular file which is called test.txt and has
	 * ;1 appended to it because apparently Nero always
	 * appends versions to all files in the joliet extension.
	 *
	 * We test to make sure the version has been stripped.
	 */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString("test/test.txt",
	    archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* End of archive. */
	assertEqualInt(ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_COMPRESS);

	/* Close the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}